

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

optional<pbrt::SquareMatrix<2>_> * __thiscall
pstd::optional<pbrt::SquareMatrix<2>_>::operator=
          (optional<pbrt::SquareMatrix<2>_> *this,optional<pbrt::SquareMatrix<2>_> *v)

{
  Float aFVar1 [2];
  SquareMatrix<2> *pSVar2;
  
  reset(this);
  if (v->set == true) {
    pSVar2 = value(v);
    aFVar1 = pSVar2->m[1];
    *(Float (*) [2])&this->optionalValue = pSVar2->m[0];
    *(Float (*) [2])((long)&this->optionalValue + 8) = aFVar1;
    this->set = true;
    reset(v);
  }
  return this;
}

Assistant:

PBRT_CPU_GPU
    optional &operator=(optional &&v) {
        reset();
        if (v.has_value()) {
            new (ptr()) T(std::move(v.value()));
            set = true;
            v.reset();
        }
        return *this;
    }